

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::Namespace::addSpecialisationParameter(Namespace *this,VariableDeclaration *v)

{
  pool_ref<soul::AST::VariableDeclaration> local_20;
  
  if (v->isConstant != false) {
    local_20.object = v;
    std::
    vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::AST::VariableDeclaration>>
              ((vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
                *)&this->constants,&local_20);
    local_20.object = v;
    std::
    vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>
    ::emplace_back<soul::pool_ref<soul::AST::ASTObject>>
              ((vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>
                *)&(this->super_ModuleBase).specialisationParams,
               (pool_ref<soul::AST::ASTObject> *)&local_20);
    return;
  }
  throwInternalCompilerError("v.isConstant","addSpecialisationParameter",0x368);
}

Assistant:

soul::Annotation toPlainAnnotation (const StringDictionary& dictionary) const
        {
            soul::Annotation a;

            for (auto& p : properties)
            {
                if (auto constValue = p.value->getAsConstant())
                    a.set (p.name->toString(), constValue->value, dictionary);
                else
                    p.value->context.throwError (Errors::unresolvedAnnotation());
            }

            return a;
        }